

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O1

void __thiscall
vkb::detail::GenericFeatureChain::add<VkPhysicalDeviceVulkan14Features>
          (GenericFeatureChain *this,VkPhysicalDeviceVulkan14Features *features)

{
  pointer *ppGVar1;
  VkStructureType VVar2;
  iterator __position;
  undefined4 uVar3;
  long lVar4;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  VkPhysicalDeviceVulkan14Features *pVVar5;
  GenericFeaturesPNextNode *pGVar6;
  GenericFeaturesPNextNode *pGVar7;
  bool bVar8;
  byte bVar9;
  GenericFeaturesPNextNode local_430;
  
  bVar9 = 0;
  pGVar7 = (this->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar6 = (this->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = pGVar7 == pGVar6;
  if (!bVar8) {
    VVar2 = pGVar7->sType;
    while (features->sType != VVar2) {
      pGVar7 = pGVar7 + 1;
      bVar8 = pGVar7 == pGVar6;
      if (bVar8) goto LAB_001403c1;
      VVar2 = pGVar7->sType;
    }
    local_430.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    memset(&local_430.pNext,0,0x408);
    pVVar5 = features;
    pGVar6 = &local_430;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar3 = *(undefined4 *)&pVVar5->field_0x4;
      pGVar6->sType = pVVar5->sType;
      *(undefined4 *)&pGVar6->field_0x4 = uVar3;
      pVVar5 = (VkPhysicalDeviceVulkan14Features *)((long)pVVar5 + (ulong)bVar9 * -0x10 + 8);
      pGVar6 = (GenericFeaturesPNextNode *)((long)pGVar6 + (ulong)bVar9 * -0x10 + 8);
    }
    GenericFeaturesPNextNode::combine(pGVar7,&local_430);
    if (!bVar8) {
      return;
    }
  }
LAB_001403c1:
  local_430.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  memset(&local_430.pNext,0,0x408);
  pGVar7 = &local_430;
  for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar3 = *(undefined4 *)&features->field_0x4;
    pGVar7->sType = features->sType;
    *(undefined4 *)&pGVar7->field_0x4 = uVar3;
    features = (VkPhysicalDeviceVulkan14Features *)((long)features + (ulong)bVar9 * -0x10 + 8);
    pGVar7 = (GenericFeaturesPNextNode *)((long)pGVar7 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  __position._M_current =
       (this->nodes).
       super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->nodes).
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::_M_realloc_insert<vkb::detail::GenericFeaturesPNextNode>(&this->nodes,__position,&local_430);
  }
  else {
    memcpy(__position._M_current,&local_430,0x410);
    ppGVar1 = &(this->nodes).
               super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  return;
}

Assistant:

void add(T const& features) noexcept {
        // If this struct is already in the list, combine it
        for (auto& node : nodes) {
            if (static_cast<VkStructureType>(features.sType) == node.sType) {
                node.combine(features);
                return;
            }
        }
        // Otherwise append to the end
        nodes.push_back(features);
    }